

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O3

void __thiscall
Json_StringAndIteratorAPI_Test::~Json_StringAndIteratorAPI_Test
          (Json_StringAndIteratorAPI_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (Json, StringAndIteratorAPI) {
    std::string const src = "null";
    {
        json::parser<json_out_callbacks> p1;
        std::string const res = p1.input (src).eof ();
        EXPECT_FALSE (p1.has_error ());
        EXPECT_EQ (res, "null");
        EXPECT_EQ (p1.coordinate (), (json::coord{5U, 1U}));
    }
    {
        json::parser<json_out_callbacks> p2;
        std::string const res = p2.input (std::begin (src), std::end (src)).eof ();
        EXPECT_FALSE (p2.has_error ());
        EXPECT_EQ (res, "null");
        EXPECT_EQ (p2.coordinate (), (json::coord{5U, 1U}));
    }
}